

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O1

X509 * x509_new_null(void)

{
  X509 *pXVar1;
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  
  pXVar1 = (X509 *)OPENSSL_zalloc(200);
  if (pXVar1 == (X509 *)0x0) {
    pXVar1 = (X509 *)0x0;
  }
  else {
    pXVar1->references = 1;
    pXVar1->ex_pathlen = -1;
    CRYPTO_new_ex_data((int)pXVar1 + 0x20,in_RSI,ad);
    CRYPTO_MUTEX_init(&pXVar1->lock);
  }
  return pXVar1;
}

Assistant:

static X509 *x509_new_null(void) {
  X509 *ret = reinterpret_cast<X509 *>(OPENSSL_zalloc(sizeof(X509)));
  if (ret == NULL) {
    return NULL;
  }

  ret->references = 1;
  ret->ex_pathlen = -1;
  CRYPTO_new_ex_data(&ret->ex_data);
  CRYPTO_MUTEX_init(&ret->lock);
  return ret;
}